

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Function::Clear(Function *this)

{
  uint32_t cached_has_bits;
  Function *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::Clear
            (&this->inputs_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::Clear(&this->block_specializations_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::Clear(&this->attributes_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->opset_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Function::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Function)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  inputs_.Clear();
  block_specializations_.Clear();
  attributes_.Clear();
  opset_.ClearToEmpty();
  _internal_metadata_.Clear<std::string>();
}